

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

uint If_DsdManCheckAndXor
               (If_DsdMan_t *p,int iFirst,uint uMaskNot,If_DsdObj_t *pObj,int nSuppAll,int LutSize,
               int fDerive,int fVerbose)

{
  If_DsdObj_t *pLits;
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  undefined1 *puVar17;
  ulong uVar18;
  int pFirsts [12];
  int pSSizes [12];
  undefined1 *local_168;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_110;
  undefined1 *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  undefined1 *local_d0;
  ulong local_c8;
  ulong local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  int local_a8 [3];
  undefined1 local_9c [44];
  ulong local_70;
  int local_68 [3];
  undefined1 local_5c [44];
  ulong uVar16;
  
  uVar15 = *(uint *)&pObj->field_0x4;
  if (uVar15 < 0x18000000) {
    __assert_fail("pObj->nFans > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x6f6,
                  "unsigned int If_DsdManCheckAndXor(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  if ((int)(uVar15 >> 3 & 0x1f) <= LutSize) {
    __assert_fail("If_DsdObjSuppSize(pObj) > LutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x6f7,
                  "unsigned int If_DsdManCheckAndXor(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  If_DsdManGetSuppSizes(p,pObj,local_68);
  iVar13 = ~nSuppAll + LutSize + (*(uint *)&pObj->field_0x4 >> 3 & 0x1f);
  if (LutSize <= iVar13) {
    __assert_fail("LimitOut < LutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x6fa,
                  "unsigned int If_DsdManCheckAndXor(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  uVar15 = uVar15 >> 0x1b;
  uVar16 = (ulong)uVar15;
  pLits = pObj + 1;
  local_168 = (undefined1 *)0x1;
  uVar10 = 0;
  do {
    uVar11 = uVar10 + 1;
    if (uVar11 < uVar16) {
      iVar2 = local_68[uVar10];
      puVar17 = local_168;
      do {
        if ((local_68[(long)puVar17] + iVar2 <= LutSize) &&
           ((int)((*(uint *)&pObj->field_0x4 >> 3 & 0x1f) - (local_68[(long)puVar17] + iVar2)) <=
            iVar13)) {
          if (fDerive == 0) {
            return 0xffffffff;
          }
          If_DsdManComputeFirstArray(p,(int *)pLits,*(uint *)&pObj->field_0x4 >> 0x1b,local_a8);
          uVar4 = If_DsdSign(p,pObj,(int)uVar10,local_a8[uVar10] + iFirst,0);
          uVar5 = If_DsdSign(p,pObj,(int)puVar17,local_a8[(long)puVar17] + iFirst,0);
          if ((uMaskNot & (uVar5 | uVar4)) == 0) {
            return uVar5 | uVar4;
          }
        }
        puVar17 = (undefined1 *)((long)puVar17 + 1);
      } while ((undefined1 *)uVar16 != puVar17);
    }
    local_168 = (undefined1 *)((long)local_168 + 1);
    uVar10 = uVar11;
  } while (uVar11 != uVar16);
  if ((*(uint *)&pObj->field_0x4 & 0xf8000000) != 0x18000000) {
    local_130 = 2;
    local_138 = 1;
    uVar10 = 0;
    do {
      uVar11 = uVar10 + 1;
      if (uVar11 < uVar16) {
        local_148 = local_130;
        uVar12 = local_138;
        do {
          uVar1 = uVar12 + 1;
          if (uVar1 < uVar16) {
            iVar2 = local_68[uVar12];
            iVar3 = local_68[uVar10];
            uVar18 = local_148;
            do {
              iVar6 = local_68[uVar18] + iVar2 + iVar3;
              if ((iVar6 <= LutSize) &&
                 ((int)((*(uint *)&pObj->field_0x4 >> 3 & 0x1f) - iVar6) <= iVar13)) {
                if (fDerive == 0) {
                  return 0xffffffff;
                }
                If_DsdManComputeFirstArray
                          (p,(int *)pLits,*(uint *)&pObj->field_0x4 >> 0x1b,local_a8);
                uVar4 = If_DsdSign(p,pObj,(int)uVar10,local_a8[uVar10] + iFirst,0);
                uVar5 = If_DsdSign(p,pObj,(int)uVar12,local_a8[uVar12] + iFirst,0);
                uVar7 = If_DsdSign(p,pObj,(int)uVar18,local_a8[uVar18] + iFirst,0);
                uVar7 = uVar7 | uVar5 | uVar4;
                if ((uMaskNot & uVar7) == 0) {
                  return uVar7;
                }
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 < uVar16);
          }
          local_148 = local_148 + 1;
          uVar12 = uVar1;
        } while (uVar1 != uVar16);
      }
      local_130 = local_130 + 1;
      local_138 = local_138 + 1;
      uVar10 = uVar11;
    } while (uVar11 != uVar15 + (uVar15 == 0));
    if ((*(uint *)&pObj->field_0x4 & 0xf8000000) != 0x20000000) {
      local_d0 = local_5c;
      local_d8 = 3;
      local_e0 = 2;
      local_e8 = 1;
      local_f0 = local_9c;
      local_110 = 0;
      do {
        uVar10 = local_110 + 1;
        if (uVar10 < uVar16) {
          local_b0 = local_f0;
          local_b8 = local_d0;
          local_c0 = local_e0;
          local_c8 = local_d8;
          uVar11 = local_e8;
          do {
            local_70 = uVar11 + 1;
            if (uVar11 + 1 < uVar16) {
              local_168 = local_b0;
              local_140 = local_c8;
              uVar12 = local_c0;
              puVar17 = local_b8;
              do {
                uVar1 = uVar12 + 1;
                if (uVar1 < uVar16) {
                  iVar2 = local_68[uVar11];
                  iVar3 = local_68[local_110];
                  iVar6 = local_68[uVar12];
                  lVar14 = 0;
                  uVar18 = local_140;
                  do {
                    iVar8 = *(int *)(puVar17 + lVar14) + iVar2 + iVar3 + iVar6;
                    if ((iVar8 <= LutSize) &&
                       ((int)((*(uint *)&pObj->field_0x4 >> 3 & 0x1f) - iVar8) <= iVar13)) {
                      if (fDerive == 0) {
                        return 0xffffffff;
                      }
                      If_DsdManComputeFirstArray
                                (p,(int *)pLits,*(uint *)&pObj->field_0x4 >> 0x1b,local_a8);
                      uVar4 = If_DsdSign(p,pObj,(int)local_110,local_a8[local_110] + iFirst,0);
                      uVar5 = If_DsdSign(p,pObj,(int)uVar11,local_a8[uVar11] + iFirst,0);
                      uVar7 = If_DsdSign(p,pObj,(int)uVar12,local_a8[uVar12] + iFirst,0);
                      uVar9 = If_DsdSign(p,pObj,(int)uVar18,*(int *)(local_168 + lVar14) + iFirst,0)
                      ;
                      uVar4 = uVar9 | uVar7 | uVar5 | uVar4;
                      if ((uMaskNot & uVar4) == 0) {
                        return uVar4;
                      }
                    }
                    uVar18 = uVar18 + 1;
                    lVar14 = lVar14 + 4;
                  } while (uVar18 < uVar16);
                }
                local_140 = local_140 + 1;
                puVar17 = puVar17 + 4;
                local_168 = local_168 + 4;
                uVar12 = uVar1;
              } while (uVar1 < uVar16);
            }
            local_c8 = local_c8 + 1;
            local_c0 = local_c0 + 1;
            local_b8 = local_b8 + 4;
            local_b0 = local_b0 + 4;
            uVar11 = local_70;
          } while (local_70 != uVar16);
        }
        local_d8 = local_d8 + 1;
        local_e0 = local_e0 + 1;
        local_e8 = local_e8 + 1;
        local_d0 = local_d0 + 4;
        local_f0 = local_f0 + 4;
        local_110 = uVar10;
        if (uVar10 == uVar15 + (uVar15 == 0)) {
          return 0;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

unsigned If_DsdManCheckAndXor( If_DsdMan_t * p, int iFirst, unsigned uMaskNot, If_DsdObj_t * pObj, int nSuppAll, int LutSize, int fDerive, int fVerbose )
{
    int i[6], LimitOut, SizeIn, SizeOut, pSSizes[DAU_MAX_VAR];
    int nFans = If_DsdObjFaninNum(pObj), pFirsts[DAU_MAX_VAR];
    unsigned uRes;
    assert( pObj->nFans > 2 );
    assert( If_DsdObjSuppSize(pObj) > LutSize );
    If_DsdManGetSuppSizes( p, pObj, pSSizes );
    LimitOut = LutSize - (nSuppAll - pObj->nSupp + 1);
    assert( LimitOut < LutSize );
    for ( i[0] = 0;      i[0] < nFans; i[0]++ )
    for ( i[1] = i[0]+1; i[1] < nFans; i[1]++ )
    {
        SizeIn = pSSizes[i[0]] + pSSizes[i[1]];
        SizeOut = pObj->nSupp - SizeIn;
        if ( SizeIn > LutSize || SizeOut > LimitOut )
            continue;
        if ( !fDerive )
            return ~0;
        If_DsdManComputeFirst( p, pObj, pFirsts );
        uRes = If_DsdSign(p, pObj, i[0], iFirst + pFirsts[i[0]], 0) | 
               If_DsdSign(p, pObj, i[1], iFirst + pFirsts[i[1]], 0);
        if ( uRes & uMaskNot )
            continue;
        return uRes;
    }
    if ( pObj->nFans == 3 )
        return 0;
    for ( i[0] = 0;      i[0] < nFans; i[0]++ )
    for ( i[1] = i[0]+1; i[1] < nFans; i[1]++ )
    for ( i[2] = i[1]+1; i[2] < nFans; i[2]++ )
    {
        SizeIn = pSSizes[i[0]] + pSSizes[i[1]] + pSSizes[i[2]];
        SizeOut = pObj->nSupp - SizeIn;
        if ( SizeIn > LutSize || SizeOut > LimitOut )
            continue;
        if ( !fDerive )
            return ~0;
        If_DsdManComputeFirst( p, pObj, pFirsts );
        uRes = If_DsdSign(p, pObj, i[0], iFirst + pFirsts[i[0]], 0) | 
               If_DsdSign(p, pObj, i[1], iFirst + pFirsts[i[1]], 0) | 
               If_DsdSign(p, pObj, i[2], iFirst + pFirsts[i[2]], 0);
        if ( uRes & uMaskNot )
            continue;
        return uRes;
    }
    if ( pObj->nFans == 4 )
        return 0;
    for ( i[0] = 0;      i[0] < nFans; i[0]++ )
    for ( i[1] = i[0]+1; i[1] < nFans; i[1]++ )
    for ( i[2] = i[1]+1; i[2] < nFans; i[2]++ )
    for ( i[3] = i[2]+1; i[3] < nFans; i[3]++ )
    {
        SizeIn = pSSizes[i[0]] + pSSizes[i[1]] + pSSizes[i[2]] + pSSizes[i[3]];
        SizeOut = pObj->nSupp - SizeIn;
        if ( SizeIn > LutSize || SizeOut > LimitOut )
            continue;
        if ( !fDerive )
            return ~0;
        If_DsdManComputeFirst( p, pObj, pFirsts );
        uRes = If_DsdSign(p, pObj, i[0], iFirst + pFirsts[i[0]], 0) | 
               If_DsdSign(p, pObj, i[1], iFirst + pFirsts[i[1]], 0) | 
               If_DsdSign(p, pObj, i[2], iFirst + pFirsts[i[2]], 0) | 
               If_DsdSign(p, pObj, i[3], iFirst + pFirsts[i[3]], 0);
        if ( uRes & uMaskNot )
            continue;
        return uRes;
    }
    return 0;
}